

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

TCount __thiscall
NJamSpell::TLangModel::GetGram3HashCount(TLangModel *this,TWordId word1,TWordId word2,TWordId word3)

{
  TWordId TVar1;
  TCount TVar2;
  tuple<unsigned_int,_unsigned_int,_unsigned_int> local_14;
  
  TVar1 = this->UnknownWordId;
  TVar2 = 0;
  if (((TVar1 != word3) && (TVar2 = 0, TVar1 != word1)) && (TVar1 != word2)) {
    local_14.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
         (_Head_base<2UL,_unsigned_int,_false>)(_Head_base<2UL,_unsigned_int,_false>)word3;
    local_14.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
    _M_head_impl = word2;
    local_14.super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
    super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = word1;
    TVar2 = GetGramHashCount<std::tuple<unsigned_int,unsigned_int,unsigned_int>>
                      (&local_14,&this->PerfectHash,&this->Buckets);
  }
  return TVar2;
}

Assistant:

TCount TLangModel::GetGram3HashCount(TWordId word1, TWordId word2, TWordId word3) const {
    if (word1 == UnknownWordId || word2 == UnknownWordId || word3 == UnknownWordId) {
        return TCount();
    }
    TGram3Key key(word1, word2, word3);
    return GetGramHashCount(key, PerfectHash, Buckets);
}